

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O0

void do_quiet_movement(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  CClass *this;
  CHAR_DATA *in_RDI;
  int chance;
  AFFECT_DATA af;
  AFFECT_DATA *paf;
  CHAR_DATA *in_stack_ffffffffffffff88;
  char_data *in_stack_ffffffffffffff90;
  
  iVar2 = get_skill(ch,argument._4_4_);
  if (iVar2 != 0) {
    iVar3 = (int)in_RDI->level;
    paf = (AFFECT_DATA *)(skill_table + gsn_quiet_movement);
    this = char_data::Class(in_stack_ffffffffffffff90);
    iVar4 = CClass::GetIndex(this);
    if (*(short *)((long)paf->bitvector + (long)iVar4 * 2 + -0x20) <= iVar3) {
      bVar1 = is_affected(in_RDI,(int)gsn_quiet_movement);
      if (bVar1) {
        send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        return;
      }
      if (in_RDI->in_room->sector_type == 3) {
        send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      else if (in_RDI->in_room->sector_type == 5) {
        send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      else {
        if (in_RDI->in_room->sector_type != 4) {
          send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
          return;
        }
        send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      iVar4 = number_percent();
      if (iVar2 < iVar4) {
        check_improve((CHAR_DATA *)af.end_fun,af.pulse_fun._4_4_,af.pulse_fun._3_1_,
                      af.tick_fun._4_4_);
        return;
      }
      check_improve((CHAR_DATA *)af.end_fun,af.pulse_fun._4_4_,af.pulse_fun._3_1_,af.tick_fun._4_4_)
      ;
      init_affect((AFFECT_DATA *)0x5eff16);
      affect_to_char((CHAR_DATA *)CONCAT44(iVar2,iVar3),paf);
      return;
    }
  }
  send_to_char((char *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  return;
}

Assistant:

void do_quiet_movement(CHAR_DATA *ch, char *argument)
{
	AFFECT_DATA af;
	int chance;

	chance = get_skill(ch, gsn_quiet_movement);

	if (chance == 0 || ch->level < skill_table[gsn_quiet_movement].skill_level[ch->Class()->GetIndex()])
	{
		send_to_char("You don't know how to move with silent stealth through the wilderness.\n\r", ch);
		return;
	}

	if (is_affected(ch, gsn_quiet_movement))
	{
		send_to_char("You are already attempting to move silently through the wilderness.\n\r", ch);
		return;
	}

	if (ch->in_room->sector_type == SECT_FOREST)
	{
		send_to_char("You attempt to move quietly through the forest.\n\r", ch);
	}
	else if (ch->in_room->sector_type == SECT_MOUNTAIN)
	{
		send_to_char("You attempt to move quietly through the mountains.\n\r", ch);
	}
	else if (ch->in_room->sector_type == SECT_HILLS)
	{
		send_to_char("You attempt to move quietly through the hills.\n\r", ch);
	}
	else
	{
		send_to_char("You aren't in the right kind of wilderness to move quietly.\n\r", ch);
		return;
	}

	if (number_percent() > chance)
	{
		check_improve(ch, gsn_quiet_movement, false, 1);
		return;
	}

	check_improve(ch, gsn_quiet_movement, true, 1);

	init_affect(&af);
	af.where = TO_AFFECTS;
	af.type = gsn_quiet_movement;
	af.aftype = AFT_SKILL;
	af.location = 0;
	af.modifier = 0;
	af.duration = ch->level;
	af.level = ch->level;
	affect_to_char(ch, &af);
}